

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O1

bool bssl::ssl_credential_matches_requested_issuers(SSL_HANDSHAKE *hs,SSL_CREDENTIAL *cred)

{
  OPENSSL_STACK *sk;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  CRYPTO_BUFFER *pCVar4;
  uint8_t *puVar5;
  size_t sVar6;
  size_t sVar7;
  bool bVar8;
  Span<const_unsigned_char> dn;
  Span<const_unsigned_char> dn_00;
  CBS cbs;
  CBS candidate;
  bool local_64;
  CBS local_50;
  CBS local_40;
  
  local_64 = true;
  if (cred->must_match_issuer == true) {
    sk = (OPENSSL_STACK *)
         (hs->ca_names)._M_t.super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>.
         _M_t.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl;
    if (sk != (OPENSSL_STACK *)0x0) {
      sVar3 = OPENSSL_sk_num(sk);
      bVar8 = sVar3 == 0;
      if (!bVar8) {
        pCVar4 = (CRYPTO_BUFFER *)OPENSSL_sk_value(sk,0);
        puVar5 = CRYPTO_BUFFER_data(pCVar4);
        sVar6 = CRYPTO_BUFFER_len(pCVar4);
        dn.size_ = sVar6;
        dn.data_ = puVar5;
        bVar1 = ssl_credential_st::ChainContainsIssuer(cred,dn);
        if (!bVar1) {
          sVar6 = 1;
          do {
            bVar8 = sVar3 == sVar6;
            if (bVar8) goto LAB_0015504d;
            pCVar4 = (CRYPTO_BUFFER *)OPENSSL_sk_value(sk,sVar6);
            puVar5 = CRYPTO_BUFFER_data(pCVar4);
            sVar7 = CRYPTO_BUFFER_len(pCVar4);
            dn_00.size_ = sVar7;
            dn_00.data_ = puVar5;
            bVar1 = ssl_credential_st::ChainContainsIssuer(cred,dn_00);
            sVar6 = sVar6 + 1;
          } while (!bVar1);
        }
        if (!bVar8) {
          return true;
        }
      }
    }
LAB_0015504d:
    if (((cred->trust_anchor_id).size_ != 0) &&
       ((hs->peer_requested_trust_anchors).
        super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
        super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
        super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_engaged == true)) {
      local_50.data =
           (hs->peer_requested_trust_anchors).
           super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
           super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
           super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload._M_value.data_;
      local_50.len = (hs->peer_requested_trust_anchors).
                     super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
                     super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
                     super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_payload._M_value.
                     size_;
      bVar8 = local_50.len == 0;
      if (!bVar8) {
        do {
          iVar2 = CBS_get_u8_length_prefixed(&local_50,&local_40);
          if ((iVar2 == 0) || (local_40.len == 0)) {
            bVar1 = false;
            ERR_put_error(0x10,0,0x44,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                          ,0x5a);
            goto LAB_0015510c;
          }
          if ((local_40.len == (cred->trust_anchor_id).size_) &&
             (iVar2 = bcmp(local_40.data,(cred->trust_anchor_id).data_,local_40.len), iVar2 == 0)) {
            bVar1 = true;
            hs->field_0x6cb = hs->field_0x6cb | 4;
            goto LAB_0015510c;
          }
          bVar8 = local_50.len == 0;
        } while (!bVar8);
      }
      bVar1 = true;
LAB_0015510c:
      if (!bVar8) {
        return bVar1;
      }
    }
    local_64 = false;
    ERR_put_error(0x10,0,0x143,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                  ,100);
  }
  return local_64;
}

Assistant:

bool ssl_credential_matches_requested_issuers(SSL_HANDSHAKE *hs,
                                              const SSL_CREDENTIAL *cred) {
  if (!cred->must_match_issuer) {
    // This credential does not need to match a requested issuer, so
    // it is good to use without a match.
    return true;
  }

  // If we have names sent by the CA extension, and this
  // credential matches it, it is good.
  if (hs->ca_names != nullptr) {
    for (const CRYPTO_BUFFER *ca_name : hs->ca_names.get()) {
      if (cred->ChainContainsIssuer(
              Span(CRYPTO_BUFFER_data(ca_name), CRYPTO_BUFFER_len(ca_name)))) {
        return true;
      }
    }
  }
  // If the credential has a trust anchor ID and it matches one sent by the
  // peer, it is good.
  if (!cred->trust_anchor_id.empty() && hs->peer_requested_trust_anchors) {
    CBS cbs = CBS(*hs->peer_requested_trust_anchors), candidate;
    while (CBS_len(&cbs) > 0) {
      if (!CBS_get_u8_length_prefixed(&cbs, &candidate) ||
          CBS_len(&candidate) == 0) {
        OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
        return false;
      }
      if (candidate == Span(cred->trust_anchor_id)) {
        hs->matched_peer_trust_anchor = true;
        return true;
      }
    }
  }

  OPENSSL_PUT_ERROR(SSL, SSL_R_NO_MATCHING_ISSUER);
  return false;
}